

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O0

void __thiscall sf::priv::JoystickManager::JoystickManager(JoystickManager *this)

{
  NonCopyable *in_RDI;
  Item *in_stack_ffffffffffffffc0;
  NonCopyable *local_20;
  
  NonCopyable::NonCopyable(in_RDI);
  local_20 = in_RDI;
  do {
    Item::Item(in_stack_ffffffffffffffc0);
    local_20 = local_20 + 0x128;
  } while (local_20 != in_RDI + 0x940);
  JoystickImpl::initialize();
  return;
}

Assistant:

JoystickManager::JoystickManager()
{
    JoystickImpl::initialize();
}